

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.cpp
# Opt level: O1

void calc<float>(options2f *opt)

{
  string *psVar1;
  func<float> fVar2;
  bool bVar3;
  autodiff_fvar<float,_1UL> aVar4;
  int iVar5;
  int *piVar6;
  long *plVar7;
  ostream *poVar8;
  runtime_error *this;
  undefined8 uVar9;
  code *pcVar10;
  undefined *puVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  real_t b0;
  result_t f;
  char local_d9;
  undefined1 local_d8 [16];
  float local_bc;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  result_t local_a0;
  float local_78;
  undefined4 uStack_74;
  float local_68;
  undefined4 uStack_64;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  fVar2 = (func<float>)(opt->Jx)._M_dataplus._M_p;
  piVar6 = __errno_location();
  iVar5 = *piVar6;
  *piVar6 = 0;
  fVar14 = strtof((char *)fVar2,(char **)&local_a0);
  if ((func<float>)local_a0.derivatives_[0]._0_8_ == fVar2) {
    std::__throw_invalid_argument("stof");
LAB_00104518:
    std::__throw_invalid_argument("stof");
LAB_00104524:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this,"Temperature should be positive");
  }
  else {
    local_68 = fVar14;
    uStack_64 = extraout_XMM0_Db;
    if (*piVar6 == 0) {
LAB_00103f07:
      *piVar6 = iVar5;
    }
    else if (*piVar6 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00103f07;
    }
    fVar2 = (func<float>)(opt->Jy)._M_dataplus._M_p;
    iVar5 = *piVar6;
    *piVar6 = 0;
    fVar14 = strtof((char *)fVar2,(char **)&local_a0);
    if ((func<float>)local_a0.derivatives_[0]._0_8_ == fVar2) goto LAB_00104518;
    local_78 = fVar14;
    uStack_74 = extraout_XMM0_Db_00;
    if (*piVar6 == 0) {
LAB_00103f4f:
      *piVar6 = iVar5;
    }
    else if (*piVar6 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00103f4f;
    }
    psVar1 = &opt->Tmin;
    iVar5 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 == 0) goto LAB_00103fc9;
      fVar2 = (func<float>)(psVar1->_M_dataplus)._M_p;
      iVar5 = *piVar6;
      *piVar6 = 0;
      fVar14 = strtof((char *)fVar2,(char **)&local_a0);
      if ((func<float>)local_a0.derivatives_[0]._0_8_ == fVar2) {
        std::__throw_invalid_argument("stof");
LAB_001045e8:
        std::__throw_invalid_argument("stof");
LAB_001045f4:
        uVar9 = std::__throw_invalid_argument("stof");
        __cxa_free_exception(piVar6);
        _Unwind_Resume(uVar9);
      }
      local_b8 = fVar14;
      if (*piVar6 == 0) {
        *piVar6 = iVar5;
      }
      else if (*piVar6 == 0x22) {
        std::__throw_out_of_range("stof");
        goto LAB_00103fc9;
      }
      fVar2 = (func<float>)(opt->Tmax)._M_dataplus._M_p;
      iVar5 = *piVar6;
      *piVar6 = 0;
      fVar14 = strtof((char *)fVar2,(char **)&local_a0);
      if ((func<float>)local_a0.derivatives_[0]._0_8_ == fVar2) goto LAB_001045e8;
      local_d8._0_4_ = fVar14;
      if (*piVar6 == 0) {
LAB_00104113:
        *piVar6 = iVar5;
      }
      else if (*piVar6 == 0x22) {
        std::__throw_out_of_range("stof");
        goto LAB_00104113;
      }
      fVar2 = (func<float>)(opt->dT)._M_dataplus._M_p;
      iVar5 = *piVar6;
      *piVar6 = 0;
      fVar14 = strtof((char *)fVar2,(char **)&local_a0);
      if ((func<float>)local_a0.derivatives_[0]._0_8_ == fVar2) goto LAB_001045f4;
      fVar15 = (float)local_d8._0_4_;
      fVar18 = local_b8;
      if (*piVar6 == 0) {
LAB_00104165:
        *piVar6 = iVar5;
      }
      else if (*piVar6 == 0x22) {
        fVar14 = (float)std::__throw_out_of_range("stof");
        goto LAB_00104165;
      }
LAB_00104168:
      lVar12 = std::cout;
      if ((0.0 <= fVar15) && (0.0 <= fVar18)) {
        if (fVar15 < fVar18) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    ((invalid_argument *)this,"Tmax should be larger than Tmin");
        }
        else {
          local_d8._0_4_ = fVar15;
          local_bc = fVar14;
          local_b8 = fVar18;
          if (0.0 < fVar14) {
            *(uint *)(strtof + *(long *)(std::cout + -0x18)) =
                 *(uint *)(strtof + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
            *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar12 + -0x18)) =
                 6;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# lattice: square\n",0x12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# precision: ",0xd);
            plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,6);
            std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
            std::ostream::put((char)plVar7);
            poVar8 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"# Lx Ly Jx Jy T 1/T F/N E/N C/N M2/N2\n",0x26);
            local_40 = (double)local_bc * 0.0001 + (double)(float)local_d8._0_4_;
            local_38 = (double)local_b8;
            if (local_38 < local_40) {
              local_48 = (double)local_68;
              local_50 = (double)local_78;
              do {
                local_d8 = ZEXT416((uint)(1.0 / local_b8));
                ising::free_energy::square::transfer_matrix<float>::calc
                          (&local_a0,opt->Lx,opt->Ly,local_68,local_78,1.0 / local_b8,0.0);
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                local_d9 = ' ';
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_d9,1);
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_d9,1);
                poVar8 = std::ostream::_M_insert<double>(local_48);
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_d9,1);
                poVar8 = std::ostream::_M_insert<double>(local_50);
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_d9,1);
                poVar8 = std::ostream::_M_insert<double>(local_38);
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_d9,1);
                poVar8 = std::ostream::_M_insert<double>((double)(float)local_d8._0_4_);
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_d9,1);
                poVar8 = std::ostream::_M_insert<double>((double)local_a0.derivatives_[0][0]);
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_d9,1);
                poVar8 = std::ostream::_M_insert<double>
                                   ((double)(local_a0.derivatives_[1][0] * (float)local_d8._0_4_ +
                                            local_a0.derivatives_[0][0]));
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_d9,1);
                poVar8 = std::ostream::_M_insert<double>
                                   ((double)(-(float)local_d8._0_4_ * (float)local_d8._0_4_ *
                                            (local_a0.derivatives_[1][0] +
                                             local_a0.derivatives_[1][0] +
                                            local_a0.derivatives_[2][0] * (float)local_d8._0_4_)));
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_d9,1);
                poVar8 = std::ostream::_M_insert<double>
                                   ((double)(-local_a0.derivatives_[0][2] / (float)local_d8._0_4_));
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                std::ostream::put((char)poVar8);
                std::ostream::flush();
                local_b8 = local_b8 + local_bc;
                local_38 = (double)local_b8;
              } while (local_38 < local_40);
            }
            return;
          }
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument((invalid_argument *)this,"dT should be positive");
        }
        goto LAB_0010459a;
      }
      goto LAB_00104524;
    }
LAB_00103fc9:
    auVar16._4_4_ = uStack_64;
    auVar16._0_4_ = local_68;
    auVar16._8_4_ = uStack_64;
    auVar16._12_4_ = uStack_74;
    auVar17._8_8_ = auVar16._8_8_;
    auVar17._4_4_ = local_78;
    auVar17._0_4_ = local_68;
    auVar17 = auVar17 & _DAT_0010d020;
    if (0.0 < auVar17._0_4_ * auVar17._4_4_) {
      fVar14 = auVar17._4_4_ + auVar17._0_4_;
      fVar14 = 1.0 / (fVar14 + fVar14);
      local_d8 = ZEXT416((uint)fVar14);
      local_a0.derivatives_[0]._0_8_ = auVar17._0_8_;
      aVar4 = anon_unknown.dwarf_ee0a::func<float>::operator()((func<float> *)&local_a0,fVar14);
      fVar14 = aVar4.v._M_elems[0];
      fVar15 = aVar4.v._M_elems[1];
      lVar12 = 0xff;
      do {
        local_b8 = (float)local_d8._0_4_;
        uStack_b4 = local_d8._4_4_;
        uStack_b0 = local_d8._8_4_;
        uStack_ac = local_d8._12_4_;
        local_d8._0_4_ = (float)local_d8._0_4_ - fVar14 / fVar15;
        aVar4 = anon_unknown.dwarf_ee0a::func<float>::operator()
                          ((func<float> *)&local_a0,(float)local_d8._0_4_);
        fVar14 = aVar4.v._M_elems[0];
        fVar15 = aVar4.v._M_elems[1];
        bVar3 = ABS((float)local_d8._0_4_ - local_b8) <
                (ABS(local_b8) + ABS(local_b8)) * 1.1920929e-07;
        bVar13 = lVar12 != 0;
        lVar12 = lVar12 + -1;
        if (ABS(fVar14) < 2.3841858e-07 || bVar3) break;
      } while (bVar13);
      if (ABS(fVar14) >= 2.3841858e-07 && !bVar3) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"convergence error");
        puVar11 = &std::runtime_error::typeinfo;
        pcVar10 = std::runtime_error::~runtime_error;
        goto LAB_001045a8;
      }
      fVar14 = 1.0 / (float)local_d8._0_4_;
      fVar15 = fVar14;
      fVar18 = fVar14;
      goto LAB_00104168;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument((invalid_argument *)this,"Jx * Jy should be non-zero");
  }
LAB_0010459a:
  puVar11 = &std::invalid_argument::typeinfo;
  pcVar10 = std::invalid_argument::~invalid_argument;
LAB_001045a8:
  __cxa_throw(this,puVar11,pcVar10);
}

Assistant:

void calc(const options2f& opt) {
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N M2/N2\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    real_t h = 0;
    auto f =
        square::transfer_matrix<real_t>::calc(opt.Lx, opt.Ly, Jx, Jy, 1 / t, h);
    typename square::transfer_matrix<real_t>::result_t beta;
    beta.set(0, 1 / t);
    std::cout << opt.Lx << ' ' << opt.Ly << ' ' << Jx << ' ' << Jy << ' ' << t
              << ' ' << (1 / t) << ' ' << free_energy(f, beta, h) << ' '
              << energy(f, beta, h) << ' ' << specific_heat(f, beta, h) << ' '
              << magnetization2(f, beta, h) << std::endl;
  }
}